

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O2

void __thiscall Balk::solve_balk(Balk *this)

{
  element_type *peVar1;
  pointer psVar2;
  shared_ptr<Term> *el;
  pointer psVar3;
  const_iterator cVar4;
  shared_ptr<Term> last;
  shared_ptr<Term> first;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  cVar4._M_current =
       (this->terms).
       super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  first.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  first.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  last.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  last.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  for (; cVar4._M_current !=
         (this->terms).
         super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>._M_impl.
         super__Vector_impl_data._M_finish; cVar4._M_current = cVar4._M_current + 1) {
    peVar1 = ((cVar4._M_current)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar1->shift == 0) && (peVar1->initial_variable != true)) {
      std::__shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&first.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>,
                 &(cVar4._M_current)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>);
      if (first.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        (*(first.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Term[3])
                  (first.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this);
        std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::erase
                  (&this->terms,cVar4);
        goto LAB_00103e62;
      }
      break;
    }
  }
  func(this,2,0.0);
  func(this,3,0.0);
LAB_00103e62:
  cVar4._M_current =
       (this->terms).
       super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  do {
    if (cVar4._M_current ==
        (this->terms).
        super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00103e90:
      if (last.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
        func(this,2,(double)this->balk_size * this->segment_length);
        func(this,3,(double)this->balk_size * this->segment_length);
      }
      else {
        (*(last.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Term[3])
                  (last.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this);
        std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::erase
                  (&this->terms,cVar4);
      }
      psVar2 = (this->terms).
               super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (psVar3 = (this->terms).
                    super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar2; psVar3 = psVar3 + 1
          ) {
        peVar1 = (psVar3->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar1->is_unknown == true) {
          (*peVar1->_vptr_Term[3])(peVar1,this);
        }
      }
      lu::solve((vector<double,_std::allocator<double>_> *)&local_38,&this->A,&this->b);
      std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->x,&local_38);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&last.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&first.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    peVar1 = ((cVar4._M_current)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar1->shift == this->balk_size) && (peVar1->initial_variable == false)) {
      std::__shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&last.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>,
                 &(cVar4._M_current)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>);
      goto LAB_00103e90;
    }
    cVar4._M_current = cVar4._M_current + 1;
  } while( true );
}

Assistant:

void Balk::solve_balk()
{
    // Count a number of unknown elements. Init with 4 because of initial variables.
    size_t unknown_num = 4;
    for (const auto &el : terms)
    {
        unknown_num += ((el->isUnknown()) && (el->getShift() != 0) && (el->getShift() != balk_size));
    }

    std::shared_ptr<Term> first = nullptr;
    std::shared_ptr<Term> last = nullptr;
    auto it = terms.begin();
    for (; it != terms.end(); ++it)
    {
        if ((it->get()->getShift() == 0) && !(it->get()->initial_variable))
        {
            first = *it;
            break;
        }
    }
    if (first == nullptr)
    { // Free begin
        func(2, 0);
        func(3, 0);
    }
    else
    {
        first->addAnEquation(*this);
        terms.erase(it);
    }

    it = terms.begin();
    for (; it != terms.end(); ++it)
    {
        if ((it->get()->getShift() == balk_size) && !(it->get()->initial_variable))
        {
            last = *it;
            break;
        }
    }
    if (last == nullptr)
    { // Free end
        func(2, segment_length * balk_size);
        func(3, segment_length * balk_size);
    }
    else
    {
        last->addAnEquation(*this);
        terms.erase(it);
    }

    for (const auto &el : terms)
    {
        if (el->isUnknown())
        {
            el->addAnEquation(*this);
        }
    }

    x = lu::solve(A, b);
}